

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<TPZFlopCounter>::SolveEigenvaluesJacobi
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,REAL *tol,
          TPZVec<TPZFlopCounter> *Sort)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  _Self __tmp;
  TPZFlopCounter *pTVar8;
  TPZFlopCounter *pTVar9;
  _Base_ptr p_Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long col;
  long col_00;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_98;
  REAL local_68;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  
  local_98 = *tol + *tol;
  TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
  lVar7 = (this->super_TPZBaseMatrix).fRow;
  lVar11 = 0;
  lVar14 = 0;
  if (0 < lVar7) {
    lVar14 = lVar7;
  }
  lVar13 = -1;
  col_00 = lVar13;
  for (; lVar11 < *numiterations; lVar11 = lVar11 + 1) {
    local_98 = 0.0;
    for (lVar12 = 0; lVar12 != lVar14; lVar12 = lVar12 + 1) {
      for (col = 0; lVar12 != col; col = col + 1) {
        pTVar8 = operator()(this,lVar12,col);
        if (ABS(local_98) < ABS(pTVar8->fVal)) {
          pTVar8 = operator()(this,lVar12,col);
          local_98 = ABS(pTVar8->fVal);
          lVar13 = lVar12;
          col_00 = col;
        }
      }
    }
    if (ABS(local_98) < *tol) break;
    pTVar8 = operator()(this,lVar13,col_00);
    dVar16 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
    pTVar8 = operator()(this,col_00,col_00);
    pTVar9 = operator()(this,lVar13,lVar13);
    dVar15 = pTVar8->fVal - pTVar9->fVal;
    myset._M_t._M_impl._0_8_ = (dVar16 + dVar16) / dVar15;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
    dVar16 = atan(dVar15);
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
    dVar15 = cos(dVar16 * 0.5);
    TPZFlopCounter::gCount.fCount[5] = TPZFlopCounter::gCount.fCount[5] + 1;
    dVar16 = sin(dVar16 * 0.5);
    TPZFlopCounter::gCount.fCount[6] = TPZFlopCounter::gCount.fCount[6] + 1;
    for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
      if ((lVar13 != lVar12) && (col_00 != lVar12)) {
        pTVar8 = operator()(this,lVar12,lVar13);
        dVar17 = pTVar8->fVal;
        TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
        pTVar8 = operator()(this,lVar12,col_00);
        TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
        dVar19 = dVar17 * dVar15 - pTVar8->fVal * dVar16;
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        pTVar8 = operator()(this,lVar12,lVar13);
        dVar17 = pTVar8->fVal;
        TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
        pTVar8 = operator()(this,lVar12,col_00);
        dVar17 = pTVar8->fVal * dVar15 + dVar17 * dVar16;
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
        pTVar8 = operator()(this,lVar12,lVar13);
        pTVar8->fVal = dVar19;
        pTVar8 = operator()(this,lVar13,lVar12);
        pTVar8->fVal = dVar19;
        pTVar8 = operator()(this,lVar12,col_00);
        pTVar8->fVal = dVar17;
        pTVar8 = operator()(this,col_00,lVar12);
        pTVar8->fVal = dVar17;
      }
    }
    pTVar8 = operator()(this,lVar13,lVar13);
    dVar17 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
    pTVar8 = operator()(this,lVar13,col_00);
    dVar19 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 3;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    pTVar8 = operator()(this,col_00,col_00);
    dVar2 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    pTVar8 = operator()(this,lVar13,lVar13);
    dVar3 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
    pTVar8 = operator()(this,lVar13,col_00);
    dVar4 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 3;
    pTVar8 = operator()(this,col_00,col_00);
    dVar5 = pTVar8->fVal;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
    pTVar8 = operator()(this,lVar13,lVar13);
    pTVar9 = operator()(this,col_00,col_00);
    dVar18 = pTVar8->fVal;
    dVar6 = pTVar9->fVal;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
    pTVar8 = operator()(this,lVar13,col_00);
    dVar18 = (dVar15 * dVar15 - dVar16 * dVar16) * pTVar8->fVal + (dVar18 - dVar6) * dVar15 * dVar16
    ;
    TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 2;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 3;
    pTVar8 = operator()(this,lVar13,lVar13);
    pTVar8->fVal = dVar2 * dVar16 * dVar16 +
                   (dVar17 * dVar15 * dVar15 - (dVar19 + dVar19) * dVar16 * dVar15);
    pTVar8 = operator()(this,col_00,col_00);
    pTVar8->fVal = dVar5 * dVar15 * dVar15 +
                   (dVar4 + dVar4) * dVar16 * dVar15 + dVar3 * dVar16 * dVar16;
    pTVar8 = operator()(this,lVar13,col_00);
    pTVar8->fVal = dVar18;
    pTVar8 = operator()(this,col_00,lVar13);
    pTVar8->fVal = dVar18;
  }
  if (Sort != (TPZVec<TPZFlopCounter> *)0x0) {
    p_Var1 = &myset._M_t._M_impl.super__Rb_tree_header;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar13 = 0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; lVar14 != lVar13; lVar13 = lVar13 + 1) {
      pTVar8 = operator()(this,lVar13,lVar13);
      local_68 = pTVar8->fVal;
      std::
      _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
      _M_insert_equal<double>(&myset._M_t,&local_68);
    }
    (*Sort->_vptr_TPZVec[3])(Sort,lVar7);
    p_Var10 = myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar7 = lVar7 * 8;
    while ((_Rb_tree_header *)p_Var10 != p_Var1) {
      *(undefined8 *)((long)&Sort->fStore[-1].fVal + lVar7) = *(undefined8 *)(p_Var10 + 1);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      lVar7 = lVar7 + -8;
    }
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree(&myset._M_t);
  }
  dVar16 = *tol;
  *tol = ABS(local_98);
  *numiterations = lVar11;
  return ABS(local_98) < dVar16;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}